

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float16 float16_muladd_mipsel(float16 a,float16 b,float16 c,int flags,float_status *status)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  uint uVar7;
  uint uVar8;
  int count;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  FloatParts FVar23;
  FloatParts FVar24;
  FloatParts FVar25;
  FloatParts p;
  FloatParts a_00;
  FloatParts b_00;
  ulong local_70;
  uint64_t hi;
  uint local_5c;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  uint64_t c_lo;
  uint64_t c_hi;
  uint uVar9;
  
  local_50 = CONCAT44(in_register_0000000c,flags);
  FVar23._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar23.frac = (ulong)(a & 0x3ff);
  FVar23 = sf_canonicalize(FVar23,&float16_params,status);
  uVar11 = FVar23._8_8_;
  local_58 = FVar23.frac;
  FVar24.frac = (ulong)(b & 0x3ff);
  FVar24._8_8_ = (ulong)(b >> 10 & 0x1f) | (ulong)(b & 0x8000) << 0x19;
  FVar24 = sf_canonicalize(FVar24,&float16_params,status);
  local_48 = FVar24.frac;
  FVar25._8_8_ = (ulong)(c >> 10 & 0x1f) | (ulong)(c & 0x8000) << 0x19;
  FVar25.frac = (ulong)(c & 0x3ff);
  FVar25 = sf_canonicalize(FVar25,&float16_params,status);
  uVar15 = FVar25.frac;
  uVar7 = 1 << (FVar24.cls & 0x1f) | 1 << (FVar23._12_4_ & 0x1f);
  if (((((undefined1  [16])FVar23 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0) ||
      (((undefined1  [16])FVar24 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) ||
     (((undefined1  [16])FVar25 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) {
    uVar15 = FVar24._8_8_ & 0xffffffffffff;
    a_00.exp = (int)uVar11;
    a_00.cls = (char)(uVar11 >> 0x20);
    a_00.sign = (_Bool)(char)(uVar11 >> 0x28);
    a_00._14_2_ = (short)(uVar11 >> 0x30);
    a_00.frac = local_58;
    b_00.exp = (int)uVar15;
    b_00.cls = (char)(uVar15 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar15 >> 0x28);
    b_00._14_2_ = (short)(uVar15 >> 0x30);
    b_00.frac = local_48;
    p = pick_nan_muladd(a_00,b_00,FVar25,uVar7 == 10,status);
    goto LAB_007c3c51;
  }
  if (uVar7 != 10) {
    uVar4 = FVar23._12_4_ & 0xff;
    uVar6 = FVar24._12_4_ & 0xff;
    uVar16 = 0x10000000000;
    uVar7 = (uint)local_50;
    uVar20 = FVar25._8_8_ & 0xffff0103ffffffff ^ 0x10000000000;
    if ((local_50 & 1) == 0) {
      uVar20 = FVar25._8_8_;
    }
    uVar10 = (FVar24._8_8_ ^ uVar11) & 0x10000000000;
    uVar18 = (ulong)(uVar10 == 0);
    if ((local_50 & 2) == 0) {
      uVar18 = uVar10 >> 0x28;
    }
    uVar17 = (uint)uVar18;
    bVar21 = uVar4 != 3;
    bVar22 = uVar6 != 3;
    uVar14 = uVar7 & 4;
    uVar9 = (uint)(uVar20 >> 0x20);
    uVar8 = uVar9 & 3;
    if (uVar8 != 3) {
      if (!bVar22 || !bVar21) {
        if (uVar14 >> 2 == uVar17) {
          uVar16 = 0;
        }
        goto LAB_007c3c3c;
      }
      uVar19 = (uint)uVar20;
      if ((bVar22 && bVar21) && (uVar6 == 1 || uVar4 == 1)) {
        if (uVar8 == 1) {
          if ((uVar9 >> 8 & 1) != uVar17) {
            uVar18 = (ulong)(status->float_rounding_mode == '\x01');
          }
          uVar20 = uVar20 & 0xffff0003ffffffff | uVar18 << 0x28;
        }
        else if ((local_50 & 8) != 0) {
          uVar20 = uVar20 & 0xffffff0300000000 | (ulong)(uVar19 - 1);
        }
        if (((uint)(uVar20 >> 0x28) & 1) == uVar14 >> 2) {
          uVar16 = 0;
        }
        uVar16 = uVar20 & 0xffff00ffffffffff | uVar16;
        p.exp = (int)uVar16;
        p.cls = (char)(uVar16 >> 0x20);
        p.sign = (_Bool)(char)(uVar16 >> 0x28);
        p._14_2_ = (short)(uVar16 >> 0x30);
        p.frac = uVar15;
        goto LAB_007c3c51;
      }
      local_5c = uVar14;
      if ((uVar4 != 2) || (uVar6 != 2)) {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      uVar16 = (local_58 & 0xffffffff) * (local_48 >> 0x20);
      uVar10 = (local_48 & 0xffffffff) * (local_58 >> 0x20);
      uVar13 = uVar10 + uVar16;
      local_70 = local_48 * local_58;
      hi = (uVar13 >> 0x20) + (local_48 >> 0x20) * (local_58 >> 0x20) +
           ((ulong)CARRY8(uVar10,uVar16) << 0x20) + (ulong)(local_70 < uVar13 << 0x20);
      uVar4 = FVar24.exp + FVar23.exp;
      if ((hi >> 0x3d & 1) != 0) {
        local_70 = (ulong)((uint)local_70 & 1) | hi << 0x3f | local_70 >> 1;
        hi = hi >> 1;
        uVar4 = uVar4 + 1;
      }
      if (uVar8 == 1) {
        local_70 = (ulong)((local_70 & 0x3fffffffffffffff) != 0) | hi << 2 | local_70 >> 0x3e;
        hi = hi >> 0x3e;
      }
      else {
        count = uVar4 - uVar19;
        if ((uVar9 >> 8 & 1) == uVar17) {
          if (count < 1) {
            uVar16 = local_70;
            shift128RightJamming(hi,local_70,0x3e - count,&hi,&local_70);
            local_70 = local_70 + uVar15;
          }
          else {
            c_hi = uVar15 >> 2;
            c_lo = 0;
            shift128RightJamming(c_hi,0,count,&c_hi,&c_lo);
            uVar15 = c_hi + hi + (ulong)CARRY8(c_lo,local_70);
            uVar16 = (ulong)((c_lo + local_70 & 0x3fffffffffffffff) != 0) |
                     uVar15 * 4 | c_lo + local_70 >> 0x3e;
            hi = uVar15 >> 0x3e;
            uVar20 = (ulong)uVar4;
            local_70 = uVar16;
          }
          uVar4 = (uint)uVar20;
          bVar21 = true;
          uVar7 = (uint)local_50;
          if ((long)local_70 < 0) {
            local_70 = (ulong)((uint)local_70 & 1) | local_70 >> 1;
            uVar4 = uVar4 + 1;
          }
        }
        else {
          uVar15 = uVar15 >> 2;
          c_lo = 0;
          c_hi = uVar15;
          if (count < 1) {
            shift128RightJamming(hi,local_70,-count,&hi,&local_70);
            if ((uVar4 == uVar19) && (uVar12 = hi - uVar15, uVar15 <= hi)) goto LAB_007c3ed9;
            bVar21 = local_70 != 0;
            local_70 = -local_70;
            hi = (uVar15 - hi) - (ulong)bVar21;
            uVar17 = (uint)(byte)((byte)uVar18 ^ 1);
          }
          else {
            shift128RightJamming(uVar15,0,count,&c_hi,&c_lo);
            bVar21 = local_70 < c_lo;
            local_70 = local_70 - c_lo;
            uVar12 = (hi - c_hi) - (ulong)bVar21;
LAB_007c3ed9:
            hi = uVar12;
            uVar20 = (ulong)uVar4;
          }
          uVar4 = (uint)uVar20;
          bVar21 = hi != 0 || local_70 != 0;
          uVar7 = (uint)local_50;
          if (hi == 0 && local_70 == 0) {
            uVar15 = 0;
            if (local_5c >> 2 != (uint)(status->float_rounding_mode == '\x01')) {
              uVar15 = 0x10000000000;
            }
            uVar11 = uVar11 & 0xffff0000ffffffff | 0x100000000 | uVar15;
            uVar16 = uVar11;
          }
          else {
            lVar1 = 0x3f;
            if (hi != 0) {
              for (; hi >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            if (local_70 == 0) {
              uVar6 = 0x40;
            }
            else {
              lVar2 = 0x3f;
              if (local_70 != 0) {
                for (; local_70 >> lVar2 == 0; lVar2 = lVar2 + -1) {
                }
              }
              uVar6 = (uint)lVar2 ^ 0x3f;
            }
            uVar8 = (uint)lVar1 ^ 0x3f;
            if (hi == 0) {
              uVar8 = uVar6 + 0x40;
            }
            if (uVar8 < 0x41) {
              bVar5 = (char)uVar8 - 1;
              bVar3 = bVar5 & 0x3f;
              hi = hi << bVar3 | local_70 >> 0x40 - bVar3;
              local_70 = local_70 << (bVar5 & 0x3f) != 0 | hi;
            }
            else {
              local_70 = local_70 << ((char)uVar8 + 0xbfU & 0x3f);
            }
            uVar4 = (uVar4 - uVar8) + 3;
            uVar16 = local_70;
          }
        }
        p.exp = (int)uVar16;
        p.cls = (char)(uVar16 >> 0x20);
        p.sign = (_Bool)(char)(uVar16 >> 0x28);
        p._14_2_ = (short)(uVar16 >> 0x30);
        p.frac = local_58;
        if (!bVar21) goto LAB_007c3c51;
      }
      uVar15 = 0x10000000000;
      if (local_5c >> 2 == uVar17) {
        uVar15 = 0;
      }
      uVar15 = (ulong)(((int)(uVar7 << 0x1c) >> 0x1f) + uVar4) | uVar11 & 0xffff000000000000 |
               uVar15 | 0x200000000;
      p.exp = (int)uVar15;
      p.cls = (char)(uVar15 >> 0x20);
      p.sign = (_Bool)(char)(uVar15 >> 0x28);
      p._14_2_ = (short)(uVar15 >> 0x30);
      p.frac = local_70;
      goto LAB_007c3c51;
    }
    if ((bVar22 && bVar21) || ((uVar9 >> 8 & 1) == uVar17)) {
      if ((uVar9 >> 8 & 1) == uVar14 >> 2) {
        uVar16 = 0;
      }
LAB_007c3c3c:
      uVar16 = uVar11 & 0xffff0000ffffffff | 0x300000000 | uVar16;
      p.exp = (int)uVar16;
      p.cls = (char)(uVar16 >> 0x20);
      p.sign = (_Bool)(char)(uVar16 >> 0x28);
      p._14_2_ = (short)(uVar16 >> 0x30);
      p.frac = local_58;
      goto LAB_007c3c51;
    }
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  uVar12 = 0x1fffffffffffffff;
  if (status->snan_bit_is_one == '\0') {
    uVar12 = 0x2000000000000000;
  }
  p.exp = 0x7fffffff;
  p.cls = float_class_qnan;
  p.sign = false;
  p._14_2_ = 0;
  p.frac = uVar12;
LAB_007c3c51:
  FVar23 = round_canonical(p,status,&float16_params);
  return (ushort)FVar23.frac & 0x3ff | (ushort)((FVar23.exp & 0x1fU) << 10) |
         (ushort)(FVar23._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 QEMU_FLATTEN float16_muladd(float16 a, float16 b, float16 c,
                                                int flags, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pc = float16_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float16_round_pack_canonical(pr, status);
}